

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

collision_shape_ptr __thiscall
APhyBullet::BulletEngine::createConeX(BulletEngine *this,aphy_scalar radius,aphy_scalar height)

{
  btConeShapeX *this_00;
  Counter *pCVar1;
  btConeShapeX *in_stack_ffffffffffffffb8;
  ref<aphy::collision_shape> *this_01;
  undefined8 in_stack_ffffffffffffffc8;
  ref<aphy::collision_shape> local_18 [3];
  
  this_00 = (btConeShapeX *)btConeShape::operator_new(0x1282df);
  btConeShapeX::btConeShapeX
            (this_00,(btScalar)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
             (btScalar)in_stack_ffffffffffffffc8);
  this_01 = local_18;
  aphy::makeObject<APhyBullet::BulletCollisionShape,btConeShapeX*>(in_stack_ffffffffffffffb8);
  pCVar1 = aphy::ref<aphy::collision_shape>::disown(this_01);
  aphy::ref<aphy::collision_shape>::~ref(this_01);
  return pCVar1;
}

Assistant:

collision_shape_ptr BulletEngine::createConeX(aphy_scalar radius, aphy_scalar height)
{
    return makeObject<BulletCollisionShape> (
        new btConeShapeX(radius, height)
    ).disown();
}